

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkUniversal::IntLoadConstraint_C
          (ChLinkUniversal *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  ulong uVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar10 [32];
  undefined1 auVar9 [32];
  
  uVar4 = (ulong)off_L;
  iVar3 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 == '\0') {
    return;
  }
  auVar7._0_8_ = c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[0];
  auVar7._8_8_ = c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[1];
  auVar7._16_8_ =
       c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
           .array[2];
  auVar7._24_8_ =
       c * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
           .array[3];
  if (do_clamp) {
    auVar8._8_8_ = recovery_clamp;
    auVar8._0_8_ = recovery_clamp;
    auVar9._16_8_ = recovery_clamp;
    auVar9._0_16_ = auVar8;
    auVar9._24_8_ = recovery_clamp;
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar6 = vxorpd_avx512vl(auVar8,auVar6);
    auVar10._0_8_ = auVar6._0_8_;
    auVar10._8_8_ = auVar10._0_8_;
    auVar10._16_8_ = auVar10._0_8_;
    auVar10._24_8_ = auVar10._0_8_;
    auVar7 = vmaxpd_avx(auVar7,auVar10);
    auVar7 = vminpd_avx(auVar7,auVar9);
  }
  uVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar4 < (long)uVar1) {
    pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[uVar4] = auVar7._0_8_ + pdVar2[uVar4];
    uVar4 = (ulong)(off_L + 1);
    if (uVar4 < uVar1) {
      auVar6 = vshufpd_avx(auVar7._0_16_,auVar7._0_16_,1);
      pdVar2[uVar4] = auVar6._0_8_ + pdVar2[uVar4];
      uVar4 = (ulong)(off_L + 2);
      if (uVar4 < uVar1) {
        uVar5 = (ulong)(off_L + 3);
        pdVar2[uVar4] = auVar7._16_8_ + pdVar2[uVar4];
        if (uVar5 < uVar1) {
          auVar6 = vshufpd_avx(auVar7._16_16_,auVar7._16_16_,1);
          pdVar2[uVar5] = auVar6._0_8_ + pdVar2[uVar5];
          return;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkUniversal::IntLoadConstraint_C(const unsigned int off_L,  ///< offset in Qc residual
                                          ChVectorDynamic<>& Qc,     ///< result: the Qc residual, Qc += c*C
                                          const double c,            ///< a scaling factor
                                          bool do_clamp,             ///< apply clamping to c*C?
                                          double recovery_clamp      ///< value for min/max clamping of c*C
                                          ) {
    if (!IsActive())
        return;

    double cnstr_x_violation = c * m_C(0);
    double cnstr_y_violation = c * m_C(1);
    double cnstr_z_violation = c * m_C(2);
    double cnstr_dot_violation = c * m_C(3);

    if (do_clamp) {
        cnstr_x_violation = ChMin(ChMax(cnstr_x_violation, -recovery_clamp), recovery_clamp);
        cnstr_y_violation = ChMin(ChMax(cnstr_y_violation, -recovery_clamp), recovery_clamp);
        cnstr_z_violation = ChMin(ChMax(cnstr_z_violation, -recovery_clamp), recovery_clamp);
        cnstr_dot_violation = ChMin(ChMax(cnstr_dot_violation, -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cnstr_x_violation;
    Qc(off_L + 1) += cnstr_y_violation;
    Qc(off_L + 2) += cnstr_z_violation;
    Qc(off_L + 3) += cnstr_dot_violation;
}